

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint32_t farmhashmk::Hash32Len5to12(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  uint in_EDX;
  ulong in_RSI;
  char *in_RDI;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  
  util::Fetch32(in_RDI);
  util::Fetch32(in_RDI + (in_RSI - 4));
  util::Fetch32(in_RDI + (in_RSI >> 1 & 4));
  util::Mur(0,0x2088fc);
  util::Mur(0,0x208907);
  uVar1 = util::Mur(0,0x208912);
  uVar1 = util::fmix(in_EDX ^ uVar1);
  return uVar1;
}

Assistant:

STATIC_INLINE uint32_t Hash32Len5to12(const char *s, size_t len, uint32_t seed = 0) {
  uint32_t a = len, b = len * 5, c = 9, d = b + seed;
  a += Fetch(s);
  b += Fetch(s + len - 4);
  c += Fetch(s + ((len >> 1) & 4));
  return fmix(seed ^ Mur(c, Mur(b, Mur(a, d))));
}